

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_load.c
# Opt level: O0

int Load_EXT_framebuffer_object(void)

{
  uint local_c;
  int numFailed;
  
  _ptrc_glBindFramebufferEXT =
       (_func_void_GLenum_GLuint *)glXGetProcAddressARB("glBindFramebufferEXT");
  local_c = (uint)(_ptrc_glBindFramebufferEXT == (_func_void_GLenum_GLuint *)0x0);
  _ptrc_glBindRenderbufferEXT =
       (_func_void_GLenum_GLuint *)glXGetProcAddressARB("glBindRenderbufferEXT");
  if (_ptrc_glBindRenderbufferEXT == (_func_void_GLenum_GLuint *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glCheckFramebufferStatusEXT =
       (_func_GLenum_GLenum *)glXGetProcAddressARB("glCheckFramebufferStatusEXT");
  if (_ptrc_glCheckFramebufferStatusEXT == (_func_GLenum_GLenum *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glDeleteFramebuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)glXGetProcAddressARB("glDeleteFramebuffersEXT");
  if (_ptrc_glDeleteFramebuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glDeleteRenderbuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)glXGetProcAddressARB("glDeleteRenderbuffersEXT");
  if (_ptrc_glDeleteRenderbuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glFramebufferRenderbufferEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint *)
       glXGetProcAddressARB("glFramebufferRenderbufferEXT");
  if (_ptrc_glFramebufferRenderbufferEXT == (_func_void_GLenum_GLenum_GLenum_GLuint *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glFramebufferTexture1DEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)
       glXGetProcAddressARB("glFramebufferTexture1DEXT");
  if (_ptrc_glFramebufferTexture1DEXT == (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glFramebufferTexture2DEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)
       glXGetProcAddressARB("glFramebufferTexture2DEXT");
  if (_ptrc_glFramebufferTexture2DEXT == (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glFramebufferTexture3DEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint_GLint_GLint *)
       glXGetProcAddressARB("glFramebufferTexture3DEXT");
  if (_ptrc_glFramebufferTexture3DEXT == (_func_void_GLenum_GLenum_GLenum_GLuint_GLint_GLint *)0x0)
  {
    local_c = local_c + 1;
  }
  _ptrc_glGenFramebuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)glXGetProcAddressARB("glGenFramebuffersEXT");
  if (_ptrc_glGenFramebuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glGenRenderbuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)glXGetProcAddressARB("glGenRenderbuffersEXT");
  if (_ptrc_glGenRenderbuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glGenerateMipmapEXT = (_func_void_GLenum *)glXGetProcAddressARB("glGenerateMipmapEXT");
  if (_ptrc_glGenerateMipmapEXT == (_func_void_GLenum *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glGetFramebufferAttachmentParameterivEXT =
       (_func_void_GLenum_GLenum_GLenum_GLint_ptr *)
       glXGetProcAddressARB("glGetFramebufferAttachmentParameterivEXT");
  if (_ptrc_glGetFramebufferAttachmentParameterivEXT ==
      (_func_void_GLenum_GLenum_GLenum_GLint_ptr *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glGetRenderbufferParameterivEXT =
       (_func_void_GLenum_GLenum_GLint_ptr *)glXGetProcAddressARB("glGetRenderbufferParameterivEXT")
  ;
  if (_ptrc_glGetRenderbufferParameterivEXT == (_func_void_GLenum_GLenum_GLint_ptr *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glIsFramebufferEXT = (_func_GLboolean_GLuint *)glXGetProcAddressARB("glIsFramebufferEXT");
  if (_ptrc_glIsFramebufferEXT == (_func_GLboolean_GLuint *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glIsRenderbufferEXT = (_func_GLboolean_GLuint *)glXGetProcAddressARB("glIsRenderbufferEXT");
  if (_ptrc_glIsRenderbufferEXT == (_func_GLboolean_GLuint *)0x0) {
    local_c = local_c + 1;
  }
  _ptrc_glRenderbufferStorageEXT =
       (_func_void_GLenum_GLenum_GLsizei_GLsizei *)glXGetProcAddressARB("glRenderbufferStorageEXT");
  if (_ptrc_glRenderbufferStorageEXT == (_func_void_GLenum_GLenum_GLsizei_GLsizei *)0x0) {
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

static int Load_EXT_framebuffer_object(void)
{
	int numFailed = 0;
	_ptrc_glBindFramebufferEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLuint))IntGetProcAddress("glBindFramebufferEXT");
	if(!_ptrc_glBindFramebufferEXT) numFailed++;
	_ptrc_glBindRenderbufferEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLuint))IntGetProcAddress("glBindRenderbufferEXT");
	if(!_ptrc_glBindRenderbufferEXT) numFailed++;
	_ptrc_glCheckFramebufferStatusEXT = (GLenum (CODEGEN_FUNCPTR *)(GLenum))IntGetProcAddress("glCheckFramebufferStatusEXT");
	if(!_ptrc_glCheckFramebufferStatusEXT) numFailed++;
	_ptrc_glDeleteFramebuffersEXT = (void (CODEGEN_FUNCPTR *)(GLsizei, const GLuint *))IntGetProcAddress("glDeleteFramebuffersEXT");
	if(!_ptrc_glDeleteFramebuffersEXT) numFailed++;
	_ptrc_glDeleteRenderbuffersEXT = (void (CODEGEN_FUNCPTR *)(GLsizei, const GLuint *))IntGetProcAddress("glDeleteRenderbuffersEXT");
	if(!_ptrc_glDeleteRenderbuffersEXT) numFailed++;
	_ptrc_glFramebufferRenderbufferEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLenum, GLuint))IntGetProcAddress("glFramebufferRenderbufferEXT");
	if(!_ptrc_glFramebufferRenderbufferEXT) numFailed++;
	_ptrc_glFramebufferTexture1DEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLenum, GLuint, GLint))IntGetProcAddress("glFramebufferTexture1DEXT");
	if(!_ptrc_glFramebufferTexture1DEXT) numFailed++;
	_ptrc_glFramebufferTexture2DEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLenum, GLuint, GLint))IntGetProcAddress("glFramebufferTexture2DEXT");
	if(!_ptrc_glFramebufferTexture2DEXT) numFailed++;
	_ptrc_glFramebufferTexture3DEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLenum, GLuint, GLint, GLint))IntGetProcAddress("glFramebufferTexture3DEXT");
	if(!_ptrc_glFramebufferTexture3DEXT) numFailed++;
	_ptrc_glGenFramebuffersEXT = (void (CODEGEN_FUNCPTR *)(GLsizei, GLuint *))IntGetProcAddress("glGenFramebuffersEXT");
	if(!_ptrc_glGenFramebuffersEXT) numFailed++;
	_ptrc_glGenRenderbuffersEXT = (void (CODEGEN_FUNCPTR *)(GLsizei, GLuint *))IntGetProcAddress("glGenRenderbuffersEXT");
	if(!_ptrc_glGenRenderbuffersEXT) numFailed++;
	_ptrc_glGenerateMipmapEXT = (void (CODEGEN_FUNCPTR *)(GLenum))IntGetProcAddress("glGenerateMipmapEXT");
	if(!_ptrc_glGenerateMipmapEXT) numFailed++;
	_ptrc_glGetFramebufferAttachmentParameterivEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLenum, GLint *))IntGetProcAddress("glGetFramebufferAttachmentParameterivEXT");
	if(!_ptrc_glGetFramebufferAttachmentParameterivEXT) numFailed++;
	_ptrc_glGetRenderbufferParameterivEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLint *))IntGetProcAddress("glGetRenderbufferParameterivEXT");
	if(!_ptrc_glGetRenderbufferParameterivEXT) numFailed++;
	_ptrc_glIsFramebufferEXT = (GLboolean (CODEGEN_FUNCPTR *)(GLuint))IntGetProcAddress("glIsFramebufferEXT");
	if(!_ptrc_glIsFramebufferEXT) numFailed++;
	_ptrc_glIsRenderbufferEXT = (GLboolean (CODEGEN_FUNCPTR *)(GLuint))IntGetProcAddress("glIsRenderbufferEXT");
	if(!_ptrc_glIsRenderbufferEXT) numFailed++;
	_ptrc_glRenderbufferStorageEXT = (void (CODEGEN_FUNCPTR *)(GLenum, GLenum, GLsizei, GLsizei))IntGetProcAddress("glRenderbufferStorageEXT");
	if(!_ptrc_glRenderbufferStorageEXT) numFailed++;
	return numFailed;
}